

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O2

void __thiscall
dg::GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildCFG
          (GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *this,
          SubgraphInfo *subginfo)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  iterator iVar3;
  __node_base *p_Var4;
  BasicBlock *succ;
  SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock> local_68;
  BasicBlock *local_58;
  const_succ_range local_50;
  
  p_Var4 = &(subginfo->blocks)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor;
    llvm::successors(&local_50,(BasicBlock *)p_Var4[1]._M_nxt);
    iVar2 = local_50.end_iterator.Idx;
    local_68.Inst = local_50.begin_iterator.Inst;
    for (local_68.Idx = local_50.begin_iterator.Idx; local_68.Idx != iVar2;
        local_68.Idx = local_68.Idx + 1) {
      local_58 = llvm::SuccIterator<const_llvm::Instruction,_const_llvm::BasicBlock>::operator*
                           (&local_68);
      iVar3 = std::
              _Hashtable<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::BasicBlock_*>,_std::hash<const_llvm::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(subginfo->blocks)._M_h,&local_58);
      ElemWithEdges<dg::dda::RWBBlock>::addSuccessor
                ((ElemWithEdges<dg::dda::RWBBlock> *)(p_Var1 + 1),
                 *(RWBBlock **)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<const_llvm::BasicBlock_*const,_dg::dda::RWBBlock_*>,_false>
                         ._M_cur + 0x10));
    }
  }
  return;
}

Assistant:

void buildCFG(SubgraphInfo &subginfo) {
        for (auto &it : subginfo.blocks) {
            auto llvmblk = it.first;
            auto *bblock = it.second;

            for (auto *succ : successors(llvmblk)) {
                auto succit = subginfo.blocks.find(succ);
                assert((succit != subginfo.blocks.end()) &&
                       "Do not have the block built");

                bblock->addSuccessor(succit->second);
            }
        }
    }